

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condition_parser.cpp
# Opt level: O0

shared_ptr<Node> ParseCondition(istream *is)

{
  bool bVar1;
  logic_error *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  istream *in_RSI;
  shared_ptr<Node> sVar2;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_70;
  shared_ptr<EmptyNode> local_68 [2];
  Token *local_48;
  undefined1 local_39;
  __normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> local_38;
  iterator current;
  vector<Token,_std::allocator<Token>_> tokens;
  istream *is_local;
  shared_ptr<Node> *top_node;
  
  Tokenize((vector<Token,_std::allocator<Token>_> *)&current,in_RSI);
  local_38._M_current =
       (Token *)std::vector<Token,_std::allocator<Token>_>::begin
                          ((vector<Token,_std::allocator<Token>_> *)&current);
  local_39 = 0;
  local_48 = (Token *)std::vector<Token,_std::allocator<Token>_>::end
                                ((vector<Token,_std::allocator<Token>_> *)&current);
  ParseExpression<__gnu_cxx::__normal_iterator<Token*,std::vector<Token,std::allocator<Token>>>>
            ((__normal_iterator<Token_*,_std::vector<Token,_std::allocator<Token>_>_> *)is,
             (Token *)&local_38,(uint)local_48);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)is);
  if (!bVar1) {
    std::make_shared<EmptyNode>();
    std::shared_ptr<Node>::operator=((shared_ptr<Node> *)is,local_68);
    std::shared_ptr<EmptyNode>::~shared_ptr(local_68);
  }
  local_70._M_current =
       (Token *)std::vector<Token,_std::allocator<Token>_>::end
                          ((vector<Token,_std::allocator<Token>_> *)&current);
  bVar1 = __gnu_cxx::operator!=(&local_38,&local_70);
  if (bVar1) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected tokens after condition");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_39 = 1;
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)&current);
  sVar2.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)is;
  return (shared_ptr<Node>)sVar2.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Node> ParseCondition(istream& is) {
    auto tokens = Tokenize(is);
    auto current = tokens.begin();
    auto top_node = ParseExpression(current, tokens.end(), 0u);

    if (!top_node) {
        top_node = make_shared<EmptyNode>();
    }

    if (current != tokens.end()) {
        throw logic_error("Unexpected tokens after condition");
    }

    return top_node;
}